

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  uint8_t *puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  undefined1 local_159;
  undefined1 local_158 [7];
  bool verified;
  tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> local_148;
  byte local_121;
  undefined1 local_120 [7];
  bool suc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> res;
  string local_100;
  undefined1 local_e0 [8];
  string x;
  string local_a0;
  undefined1 local_80 [8];
  Secp256K1 p;
  allocator local_31;
  undefined1 local_30 [8];
  string key;
  
  key.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,"f7c32876271e88dbb576d575170de7162aed93a398deec0f7fdb330bc3f49956",
             &local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Secp256K1::Secp256K1((Secp256K1 *)local_80,(string *)local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,"Private key: ");
  Secp256K1::privateKeyHex_abi_cxx11_(&local_a0,(Secp256K1 *)local_80);
  poVar2 = std::operator<<(poVar2,(string *)&local_a0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_a0);
  poVar2 = std::operator<<((ostream *)&std::cout,"Public key: ");
  Secp256K1::publicKeyHex_abi_cxx11_((string *)((long)&x.field_2 + 8),(Secp256K1 *)local_80);
  poVar2 = std::operator<<(poVar2,(string *)(x.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(x.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,
             "de7761f8874d23d4e8f3f26f321ade560556c23c8d7c7c8227bfefaa83f2c485b511d12037bd1e1f9730f5cc031784e895d263f557793215c2f401f3cc5cfe2f"
             ,(allocator *)
              ((long)&res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  Secp256K1::base16Decode((string *)local_e0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&res.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
  puVar3 = (uint8_t *)std::__cxx11::string::c_str();
  Secp256K1::Sign(&local_148,(Secp256K1 *)local_80,puVar3);
  std::tie<std::vector<unsigned_char,std::allocator<unsigned_char>>,bool>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158,(bool *)local_120);
  std::tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>&,bool&>::operator=
            ((tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>&,bool&> *)local_158,
             &local_148);
  std::tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>::~tuple(&local_148);
  if ((local_121 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"\nsignature success");
    puVar3 = (uint8_t *)std::__cxx11::string::c_str();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_178,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
    Secp256K1::publicKey(&local_190,(Secp256K1 *)local_80);
    bVar1 = Secp256K1::Verify(puVar3,&local_178,&local_190);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_190);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_178);
    local_159 = bVar1;
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"\nVerified!!!\n");
    }
  }
  key.field_2._12_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
  std::__cxx11::string::~string((string *)local_e0);
  Secp256K1::~Secp256K1((Secp256K1 *)local_80);
  std::__cxx11::string::~string((string *)local_30);
  return key.field_2._12_4_;
}

Assistant:

int main()
{
    std::string key = "f7c32876271e88dbb576d575170de7162aed93a398deec0f7fdb330bc3f49956";
    Secp256K1 p { key };
    std::cout << "Private key: " << p.privateKeyHex() << std::endl;
    std::cout << "Public key: " << p.publicKeyHex() << std::endl;

    std::string x = Secp256K1::base16Decode("de7761f8874d23d4e8f3f26f321ade560556c23c8d7c7c8227bfefaa83f2c485b511d12037bd1e1f9730f5cc031784e895d263f557793215c2f401f3cc5cfe2f");
    std::vector<uint8_t> res;

    bool suc;
    std::tie(res, suc) = p.Sign((const unsigned char*)x.c_str());
    if (suc) {
        std::cout << "\nsignature success";

        bool verified = Secp256K1::Verify((const uint8_t*)x.c_str(), res, p.publicKey());
        //        bool verified = p.Verify((const uint8_t*)x.c_str(), res);
        if (verified) {
            std::cout << "\nVerified!!!\n";
        }
    }
    return 0;
}